

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O1

void __thiscall
QTapTestLogger::addIncident
          (QTapTestLogger *this,IncidentTypes type,char *description,char *file,int line)

{
  char cVar1;
  long lVar2;
  long lVar3;
  QArrayData *pQVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  Data *pDVar7;
  qsizetype qVar8;
  QString *pQVar9;
  undefined1 *puVar10;
  int iVar11;
  storage_type *psVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  char16_t *pcVar17;
  storage_type *psVar18;
  undefined4 in_register_00000084;
  char *pcVar19;
  byte bVar20;
  char16_t *pcVar21;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QLatin1String QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QAnyStringView QVar33;
  QAnyStringView QVar34;
  QLatin1String QVar35;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QArrayData *local_590;
  char *local_588;
  QArrayData *local_568;
  undefined8 *local_560;
  QArrayData *local_550;
  undefined8 *local_548;
  QString local_538;
  QString local_518;
  QStringBuilder<QLatin1String,_const_QString_&> local_4f8;
  QString local_4d8;
  anon_class_8_1_a847c8e5 local_4c0;
  QArrayData *local_4b8;
  char *pcStack_4b0;
  QString *local_4a8;
  QArrayData *local_498;
  char16_t *pcStack_490;
  undefined1 *local_488;
  QRegularExpressionMatch match;
  QArrayData *local_478;
  undefined1 *puStack_470;
  undefined1 *local_468;
  QTestCharBuffer message;
  QTestCharBuffer directive;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar15 = (this->m_firstExpectedFail).buf;
  cVar1 = *pcVar15;
  if (cVar1 == '\0' && type < BlacklistedXFail) {
    bVar20 = 0xb3 >> ((byte)type & 0x1f);
  }
  else {
    bVar20 = 0;
  }
  pcVar14 = "SKIP";
  switch(type) {
  case Skip:
    break;
  case Pass:
    pcVar14 = pcVar15;
    if (cVar1 == '\0') goto switchD_001262a2_caseD_3;
    break;
  case XFail:
  case XPass:
  case BlacklistedFail:
  case BlacklistedXPass:
  case BlacklistedXFail:
switchD_001262a2_caseD_2:
    pcVar14 = "TODO";
    break;
  default:
switchD_001262a2_caseD_3:
    pcVar14 = (char *)0x0;
    break;
  case BlacklistedPass:
    pcVar14 = pcVar15;
    if (cVar1 == '\0') goto switchD_001262a2_caseD_2;
  }
  memset(&directive,0xaa,0x210);
  directive._size = 0x200;
  directive.buf = directive.staticBuf;
  directive.staticBuf[0] = '\0';
  if (pcVar14 != (char *)0x0) {
    pcVar19 = "";
    pcVar15 = " # ";
    if (type == XFail || type == BlacklistedXFail) {
      pcVar15 = "";
    }
    if ((description != (char *)0x0) && (pcVar19 = " ", *description == '\0')) {
      pcVar19 = "";
    }
    QTest::qt_asprintf(&directive,"%s%s%s%s",pcVar15,pcVar14,pcVar19,description);
  }
  if ((type == XFail) || (type == BlacklistedXFail)) {
    if ((this->m_gatherMessages == true) && (*(this->m_firstExpectedFail).buf == '\0')) {
      QTestPrivate::appendCharBuffer(&this->m_firstExpectedFail,&directive);
    }
  }
  else {
    this->m_gatherMessages = false;
    iVar11 = QTestLog::totalCount();
    outputTestLine(this,(bool)(bVar20 & 1),iVar11,&directive);
  }
  pcVar15 = (this->m_comments).buf;
  if (*pcVar15 != '\0') {
    QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,pcVar15);
    *(this->m_comments).buf = '\0';
  }
  if (((bVar20 & 1) != 0) && (*(this->m_messages).buf == '\0')) goto LAB_0012733b;
  if ((type == BlacklistedXFail) || (type == XFail)) {
    memset(&message,0xaa,0x210);
    message._size = 0x200;
    message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
    pcVar15 = "  # xfail:%s\n";
    if (this->m_gatherMessages != false) {
      pcVar15 = "    - severity: xfail\n      message:%s\n";
    }
    message.buf = message.staticBuf;
    QTest::qt_asprintf(&message,pcVar15,directive.buf + 4);
    outputBuffer(this,&message);
    if (message.buf != message.staticBuf) {
      free(message.buf);
    }
  }
  else {
    QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,"  ---\n");
  }
  if ((type == BlacklistedXFail) || (type == XFail)) {
    if (this->m_gatherMessages == true) {
      pcVar15 = "      ";
      goto LAB_001264b1;
    }
  }
  else {
    pcVar15 = "  ";
LAB_001264b1:
    if ((bVar20 & 1) == 0) {
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::verifyRegex
           == '\0') &&
         (iVar11 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                        ::verifyRegex), iVar11 != 0)) {
        message._size = 0;
        message._4_4_ = 0;
        message.buf = 
        "^\'(?<actualexpression>.*)\' returned (?<actual>\\w+)\\. \\((?<message>.*)\\)$";
        message.staticBuf[0] = 'H';
        message.staticBuf[1] = '\0';
        message.staticBuf[2] = '\0';
        message.staticBuf[3] = '\0';
        message.staticBuf[4] = '\0';
        message.staticBuf[5] = '\0';
        message.staticBuf[6] = '\0';
        message.staticBuf[7] = '\0';
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    verifyRegex,&message,0);
        if (message._0_8_ != 0) {
          LOCK();
          *(int *)message._0_8_ = *(int *)message._0_8_ + -1;
          UNLOCK();
          if (*(int *)message._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)message._0_8_,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      verifyRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::verifyRegex);
      }
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::compareRegex
           == '\0') &&
         (iVar11 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                        ::compareRegex), iVar11 != 0)) {
        message._size = 0;
        message._4_4_ = 0;
        message.buf = 
        "^(?<message>.*)\n\\s*Actual\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n\\s*Expected\\s+\\((?<expectedexpresssion>.*)\\)\\s*: (?<expected>.*)$"
        ;
        message.staticBuf[0] = -0x75;
        message.staticBuf[1] = '\0';
        message.staticBuf[2] = '\0';
        message.staticBuf[3] = '\0';
        message.staticBuf[4] = '\0';
        message.staticBuf[5] = '\0';
        message.staticBuf[6] = '\0';
        message.staticBuf[7] = '\0';
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareRegex,&message,0);
        if (message._0_8_ != 0) {
          LOCK();
          *(int *)message._0_8_ = *(int *)message._0_8_ + -1;
          UNLOCK();
          if (*(int *)message._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)message._0_8_,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      compareRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareRegex);
      }
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
           compareOpRegex == '\0') &&
         (iVar11 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                        ::compareOpRegex), iVar11 != 0)) {
        message._size = 0;
        message._4_4_ = 0;
        message.buf = 
        "^(?<message>.*)\n\\s*Computed\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n\\s*Baseline\\s+\\((?<expectedexpresssion>.*)\\)\\s*: (?<expected>.*)$"
        ;
        message.staticBuf[0] = -0x73;
        message.staticBuf[1] = '\0';
        message.staticBuf[2] = '\0';
        message.staticBuf[3] = '\0';
        message.staticBuf[4] = '\0';
        message.staticBuf[5] = '\0';
        message.staticBuf[6] = '\0';
        message.staticBuf[7] = '\0';
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareOpRegex,&message,0);
        if (message._0_8_ != 0) {
          LOCK();
          *(int *)message._0_8_ = *(int *)message._0_8_ + -1;
          UNLOCK();
          if (*(int *)message._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)message._0_8_,2,0x10);
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      compareOpRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareOpRegex);
      }
      local_468 = &DAT_aaaaaaaaaaaaaaaa;
      local_478 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_470 = &DAT_aaaaaaaaaaaaaaaa;
      if (description == (char *)0x0) {
        psVar18 = (storage_type *)0x0;
      }
      else {
        psVar12 = (storage_type *)0xffffffffffffffff;
        do {
          psVar18 = psVar12 + 1;
          pcVar19 = description + 1 + (long)psVar12;
          psVar12 = psVar18;
        } while (*pcVar19 != '\0');
      }
      QVar22.m_data = psVar18;
      QVar22.m_size = (qsizetype)&local_478;
      QString::fromUtf8(QVar22);
      _match = &DAT_aaaaaaaaaaaaaaaa;
      QRegularExpression::match
                (&match,&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                         ::verifyRegex,&local_478,0,0,0);
      bVar20 = QRegularExpressionMatch::hasMatch();
      if (bVar20 == 0) {
        QRegularExpression::match
                  (&message,&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareRegex,&local_478,0,0,0);
        puVar10 = _match;
        _match = (undefined1 *)message._0_8_;
        message._0_8_ = puVar10;
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&message);
        bVar20 = QRegularExpressionMatch::hasMatch();
        uVar16 = (uint)bVar20;
      }
      else {
        uVar16 = (uint)bVar20 * 2;
      }
      if (uVar16 == 0) {
        QRegularExpression::match
                  (&message,&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareOpRegex,&local_478,0,0,0);
        puVar10 = _match;
        _match = (undefined1 *)message._0_8_;
        message._0_8_ = puVar10;
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&message);
        bVar20 = QRegularExpressionMatch::hasMatch();
        uVar16 = (uint)bVar20 + (uint)bVar20 * 2;
      }
      if (uVar16 == 0) {
        if (pcVar14 == (char *)0x0 && description != (char *)0x0) {
          memset(&message,0xaa,0x210);
          message._size = 0x200;
          message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
          message.buf = message.staticBuf;
          QTest::qt_asprintf(&message,"  # %s\n",description);
          outputBuffer(this,&message);
          if (message.buf != message.staticBuf) {
            free(message.buf);
          }
        }
      }
      else {
        local_488 = &DAT_aaaaaaaaaaaaaaaa;
        local_498 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_490 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QVar23.m_size = (size_t)&match;
        QVar23.field_0.m_data = &local_498;
        QRegularExpressionMatch::captured(QVar23);
        local_4b8 = (QArrayData *)0x0;
        pcStack_4b0 = (char *)0x0;
        local_4a8 = (QString *)0x0;
        local_4d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_4d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_4d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        key.m_data = "actualexpression";
        key.m_size = 0x10;
        local_4c0.match = &match;
        addIncident::anon_class_8_1_a847c8e5::operator()(&local_4d8,&local_4c0,key);
        if (uVar16 == 1) {
          QVar26.m_size = (size_t)&match;
          QVar26.field_0.m_data = &local_518;
          QRegularExpressionMatch::captured(QVar26);
          key_00.m_data = "expectedexpresssion";
          key_00.m_size = 0x13;
          addIncident::anon_class_8_1_a847c8e5::operator()(&local_538,&local_4c0,key_00);
          qVar6 = local_518.d.size;
          message.buf = (char *)local_518.d.ptr;
          message._0_8_ = local_518.d.d;
          qVar5 = local_538.d.size;
          message.staticBuf._16_8_ = local_538.d.ptr;
          message.staticBuf._8_8_ = local_538.d.d;
          local_518.d.d = (Data *)0x0;
          local_518.d.ptr = (char16_t *)0x0;
          local_518.d.size = 0;
          qVar8 = local_518.d.size;
          local_518.d.size._0_1_ = (undefined1)qVar6;
          local_518.d.size._1_1_ = SUB81(qVar6,1);
          local_518.d.size._2_1_ = SUB81(qVar6,2);
          local_518.d.size._3_1_ = SUB81(qVar6,3);
          local_518.d.size._4_1_ = SUB81(qVar6,4);
          local_518.d.size._5_1_ = SUB81(qVar6,5);
          local_518.d.size._6_1_ = SUB81(qVar6,6);
          local_518.d.size._7_1_ = SUB81(qVar6,7);
          message.staticBuf[0] = (undefined1)local_518.d.size;
          message.staticBuf[1] = local_518.d.size._1_1_;
          message.staticBuf[2] = local_518.d.size._2_1_;
          message.staticBuf[3] = local_518.d.size._3_1_;
          message.staticBuf[4] = local_518.d.size._4_1_;
          message.staticBuf[5] = local_518.d.size._5_1_;
          message.staticBuf[6] = local_518.d.size._6_1_;
          message.staticBuf[7] = local_518.d.size._7_1_;
          local_538.d.d = (Data *)0x0;
          local_538.d.ptr = (char16_t *)0x0;
          local_538.d.size = 0;
          qVar6 = local_538.d.size;
          local_538.d.size._0_1_ = (undefined1)qVar5;
          local_538.d.size._1_1_ = SUB81(qVar5,1);
          local_538.d.size._2_1_ = SUB81(qVar5,2);
          local_538.d.size._3_1_ = SUB81(qVar5,3);
          local_538.d.size._4_1_ = SUB81(qVar5,4);
          local_538.d.size._5_1_ = SUB81(qVar5,5);
          local_538.d.size._6_1_ = SUB81(qVar5,6);
          local_538.d.size._7_1_ = SUB81(qVar5,7);
          message.staticBuf[0x18] = (undefined1)local_538.d.size;
          message.staticBuf[0x19] = local_538.d.size._1_1_;
          message.staticBuf[0x1a] = local_538.d.size._2_1_;
          message.staticBuf[0x1b] = local_538.d.size._3_1_;
          message.staticBuf[0x1c] = local_538.d.size._4_1_;
          message.staticBuf[0x1d] = local_538.d.size._5_1_;
          message.staticBuf[0x1e] = local_538.d.size._6_1_;
          message.staticBuf[0x1f] = local_538.d.size._7_1_;
          local_538.d.size = qVar6;
          local_518.d.size = qVar8;
          QStringBuilder<QString,_QString>::convertTo<QString>
                    ((QString *)&local_4f8,(QStringBuilder<QString,_QString> *)&message);
          pcVar14 = local_4f8.a.m_data;
          local_590 = (QArrayData *)local_4f8.a.m_size;
          local_4f8.a.m_size = 0;
          local_4f8.a.m_data = (char *)0x0;
          local_4f8.b = (QString *)0x0;
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)&message);
          if (&(local_538.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_538.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
            }
          }
          QVar27.m_size = (size_t)&match;
          QVar27.field_0.m_data = &local_518;
          QRegularExpressionMatch::captured(QVar27);
          qVar5 = local_518.d.size;
          message.buf = (char *)local_518.d.ptr;
          message._0_8_ = local_518.d.d;
          local_518.d.d = (Data *)0x0;
          local_518.d.ptr = (char16_t *)0x0;
          local_518.d.size = 0;
          qVar6 = local_518.d.size;
          local_518.d.size._0_1_ = (undefined1)qVar5;
          local_518.d.size._1_1_ = SUB81(qVar5,1);
          local_518.d.size._2_1_ = SUB81(qVar5,2);
          local_518.d.size._3_1_ = SUB81(qVar5,3);
          local_518.d.size._4_1_ = SUB81(qVar5,4);
          local_518.d.size._5_1_ = SUB81(qVar5,5);
          local_518.d.size._6_1_ = SUB81(qVar5,6);
          local_518.d.size._7_1_ = SUB81(qVar5,7);
          message.staticBuf[0] = (undefined1)local_518.d.size;
          message.staticBuf[1] = local_518.d.size._1_1_;
          message.staticBuf[2] = local_518.d.size._2_1_;
          message.staticBuf[3] = local_518.d.size._3_1_;
          message.staticBuf[4] = local_518.d.size._4_1_;
          message.staticBuf[5] = local_518.d.size._5_1_;
          message.staticBuf[6] = local_518.d.size._6_1_;
          message.staticBuf[7] = local_518.d.size._7_1_;
          local_518.d.size = qVar6;
          message.staticBuf._8_8_ = &local_4d8;
          QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                    ((QString *)&local_4f8,(QStringBuilder<QString,_const_QString_&> *)&message);
          pcVar19 = pcStack_4b0;
          pQVar4 = local_4b8;
          pQVar9 = local_4f8.b;
          qVar5 = local_4f8.a.m_size;
          local_4f8.a.m_size = (qsizetype)local_4b8;
          local_4b8 = (QArrayData *)qVar5;
          pcStack_4b0 = local_4f8.a.m_data;
          local_4f8.a.m_data = pcVar19;
          local_4f8.b = local_4a8;
          local_4a8 = pQVar9;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
          if (message._0_8_ != 0) {
            LOCK();
            *(int *)message._0_8_ = *(int *)message._0_8_ + -1;
            UNLOCK();
            if (*(int *)message._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)message._0_8_,2,0x10);
            }
          }
          if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_588 = "QCOMPARE";
        }
        else if (uVar16 == 2) {
          QVar24.m_size = (size_t)&match;
          QVar24.field_0.m_data = &local_538;
          QRegularExpressionMatch::captured(QVar24);
          QString::toLower_helper(&local_518);
          qVar5 = local_518.d.size;
          message.buf = (char *)local_518.d.ptr;
          message._0_8_ = local_518.d.d;
          local_518.d.d = (Data *)0x0;
          local_518.d.ptr = (char16_t *)0x0;
          local_518.d.size = 0;
          qVar6 = local_518.d.size;
          local_518.d.size._0_1_ = (undefined1)qVar5;
          local_518.d.size._1_1_ = SUB81(qVar5,1);
          local_518.d.size._2_1_ = SUB81(qVar5,2);
          local_518.d.size._3_1_ = SUB81(qVar5,3);
          local_518.d.size._4_1_ = SUB81(qVar5,4);
          local_518.d.size._5_1_ = SUB81(qVar5,5);
          local_518.d.size._6_1_ = SUB81(qVar5,6);
          local_518.d.size._7_1_ = SUB81(qVar5,7);
          message.staticBuf[0] = (undefined1)local_518.d.size;
          message.staticBuf[1] = local_518.d.size._1_1_;
          message.staticBuf[2] = local_518.d.size._2_1_;
          message.staticBuf[3] = local_518.d.size._3_1_;
          message.staticBuf[4] = local_518.d.size._4_1_;
          message.staticBuf[5] = local_518.d.size._5_1_;
          message.staticBuf[6] = local_518.d.size._6_1_;
          message.staticBuf[7] = local_518.d.size._7_1_;
          local_518.d.size = qVar6;
          message.staticBuf._8_8_ = &local_4d8;
          QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                    ((QString *)&local_4f8,(QStringBuilder<QString,_const_QString_&> *)&message);
          pcVar14 = pcStack_4b0;
          pQVar4 = local_4b8;
          pQVar9 = local_4f8.b;
          qVar5 = local_4f8.a.m_size;
          local_4f8.a.m_size = (qsizetype)local_4b8;
          local_4b8 = (QArrayData *)qVar5;
          pcStack_4b0 = local_4f8.a.m_data;
          local_4f8.a.m_data = pcVar14;
          local_4f8.b = local_4a8;
          local_4a8 = pQVar9;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
          if (message._0_8_ != 0) {
            LOCK();
            *(int *)message._0_8_ = *(int *)message._0_8_ + -1;
            UNLOCK();
            if (*(int *)message._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)message._0_8_,2,0x10);
            }
          }
          if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_538.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_538.d.d)->super_QArrayData,2,0x10);
            }
          }
          QVar25.m_data = (char *)0x5;
          QVar25.m_size = (qsizetype)&local_4b8;
          bVar20 = QString::startsWith(QVar25,0x157855);
          local_4f8.a.m_size = (ulong)bVar20 + 4;
          local_4f8.a.m_data = "true";
          if (bVar20 != 0) {
            local_4f8.a.m_data = "false";
          }
          local_4f8.b = &local_4d8;
          QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>
                    ((QString *)&message,&local_4f8);
          pQVar4 = local_498;
          local_590 = (QArrayData *)message._0_8_;
          local_588 = "QVERIFY";
          pcVar14 = message.buf;
          if (local_488 == (undefined1 *)0x0) {
            local_498 = (QArrayData *)0x0;
            pcStack_490 = L"Verification failed";
            local_488 = (undefined1 *)0x13;
            if (pQVar4 != (QArrayData *)0x0) {
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              iVar11 = (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i;
              UNLOCK();
              goto joined_r0x00126f75;
            }
          }
        }
        else {
          QVar28.m_data = (char *)0x9;
          QVar28.m_size = (qsizetype)&local_498;
          lVar13 = QString::indexOf(QVar28,0x157946,CaseInsensitive);
          if (lVar13 == -1) {
            QVar29.m_data = (char *)0x15;
            QVar29.m_size = (qsizetype)&local_498;
            lVar13 = QString::indexOf(QVar29,0x157960,CaseInsensitive);
            if (lVar13 == -1) {
              QVar30.m_data = (char *)0x18;
              QVar30.m_size = (qsizetype)&local_498;
              lVar13 = QString::indexOf(QVar30,0x157986,CaseInsensitive);
              if (lVar13 == -1) {
                QVar31.m_data = (char *)0x9;
                QVar31.m_size = (qsizetype)&local_498;
                lVar13 = QString::indexOf(QVar31,0x1579af,CaseInsensitive);
                if (lVar13 == -1) {
                  QVar32.m_data = (char *)0xc;
                  QVar32.m_size = (qsizetype)&local_498;
                  lVar13 = QString::indexOf(QVar32,0x1579c8,CaseInsensitive);
                  if (lVar13 == -1) {
                    QVar35.m_data = (char *)0xe;
                    QVar35.m_size = (qsizetype)&local_498;
                    lVar13 = QString::indexOf(QVar35,0x1579e1,CaseInsensitive);
                    local_588 = "QCOMPARE_EQ";
                    if (lVar13 == -1) {
                      local_588 = "Unknown";
                    }
                    pcVar14 = "== ";
                    if (lVar13 == -1) {
                      pcVar14 = "";
                    }
                  }
                  else {
                    pcVar14 = "> ";
                    local_588 = "QCOMPARE_GT";
                  }
                }
                else {
                  pcVar14 = "< ";
                  local_588 = "QCOMPARE_LT";
                }
              }
              else {
                pcVar14 = ">= ";
                local_588 = "QCOMPARE_GE";
              }
            }
            else {
              pcVar14 = "<= ";
              local_588 = "QCOMPARE_LE";
            }
          }
          else {
            pcVar14 = "!= ";
            local_588 = "QCOMPARE_NE";
          }
          lVar13 = -1;
          do {
            lVar3 = lVar13 + 1;
            lVar13 = lVar13 + 1;
          } while (pcVar14[lVar3] != '\0');
          QVar33.m_size = (size_t)&match;
          QVar33.field_0.m_data = &local_518;
          QRegularExpressionMatch::captured(QVar33);
          qVar6 = local_518.d.size;
          pcVar21 = local_518.d.ptr;
          pDVar7 = local_518.d.d;
          local_518.d.d = (Data *)0x0;
          local_518.d.ptr = (char16_t *)0x0;
          local_518.d.size = 0;
          key_01.m_data = "expectedexpresssion";
          key_01.m_size = 0x13;
          addIncident::anon_class_8_1_a847c8e5::operator()(&local_538,&local_4c0,key_01);
          qVar8 = local_518.d.size;
          qVar5 = local_538.d.size;
          message.staticBuf._32_8_ = local_538.d.ptr;
          message.staticBuf._24_8_ = local_538.d.d;
          message.staticBuf._0_8_ = pDVar7;
          message.staticBuf._8_8_ = pcVar21;
          local_518.d.size._0_1_ = (undefined1)qVar6;
          local_518.d.size._1_1_ = SUB81(qVar6,1);
          local_518.d.size._2_1_ = SUB81(qVar6,2);
          local_518.d.size._3_1_ = SUB81(qVar6,3);
          local_518.d.size._4_1_ = SUB81(qVar6,4);
          local_518.d.size._5_1_ = SUB81(qVar6,5);
          local_518.d.size._6_1_ = SUB81(qVar6,6);
          local_518.d.size._7_1_ = SUB81(qVar6,7);
          message.staticBuf[0x10] = (undefined1)local_518.d.size;
          message.staticBuf[0x11] = local_518.d.size._1_1_;
          message.staticBuf[0x12] = local_518.d.size._2_1_;
          message.staticBuf[0x13] = local_518.d.size._3_1_;
          message.staticBuf[0x14] = local_518.d.size._4_1_;
          message.staticBuf[0x15] = local_518.d.size._5_1_;
          message.staticBuf[0x16] = local_518.d.size._6_1_;
          message.staticBuf[0x17] = local_518.d.size._7_1_;
          local_538.d.d = (Data *)0x0;
          local_538.d.ptr = (char16_t *)0x0;
          local_538.d.size = 0;
          qVar6 = local_538.d.size;
          local_538.d.size._0_1_ = (undefined1)qVar5;
          local_538.d.size._1_1_ = SUB81(qVar5,1);
          local_538.d.size._2_1_ = SUB81(qVar5,2);
          local_538.d.size._3_1_ = SUB81(qVar5,3);
          local_538.d.size._4_1_ = SUB81(qVar5,4);
          local_538.d.size._5_1_ = SUB81(qVar5,5);
          local_538.d.size._6_1_ = SUB81(qVar5,6);
          local_538.d.size._7_1_ = SUB81(qVar5,7);
          message.staticBuf[0x28] = (undefined1)local_538.d.size;
          message.staticBuf[0x29] = local_538.d.size._1_1_;
          message.staticBuf[0x2a] = local_538.d.size._2_1_;
          message.staticBuf[0x2b] = local_538.d.size._3_1_;
          message.staticBuf[0x2c] = local_538.d.size._4_1_;
          message.staticBuf[0x2d] = local_538.d.size._5_1_;
          message.staticBuf[0x2e] = local_538.d.size._6_1_;
          message.staticBuf[0x2f] = local_538.d.size._7_1_;
          local_538.d.size = qVar6;
          local_518.d.size = qVar8;
          message._0_8_ = lVar13;
          message.buf = pcVar14;
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::convertTo<QString>
                    ((QString *)&local_4f8,
                     (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *)&message);
          pcVar14 = local_4f8.a.m_data;
          local_590 = (QArrayData *)local_4f8.a.m_size;
          local_4f8.a.m_size = 0;
          local_4f8.a.m_data = (char *)0x0;
          local_4f8.b = (QString *)0x0;
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *)&message);
          if (&(local_538.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_538.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
            }
          }
          QVar34.m_size = (size_t)&match;
          QVar34.field_0.m_data = &local_518;
          QRegularExpressionMatch::captured(QVar34);
          qVar5 = local_518.d.size;
          message.buf = (char *)local_518.d.ptr;
          message._0_8_ = local_518.d.d;
          local_518.d.d = (Data *)0x0;
          local_518.d.ptr = (char16_t *)0x0;
          local_518.d.size = 0;
          qVar6 = local_518.d.size;
          local_518.d.size._0_1_ = (undefined1)qVar5;
          local_518.d.size._1_1_ = SUB81(qVar5,1);
          local_518.d.size._2_1_ = SUB81(qVar5,2);
          local_518.d.size._3_1_ = SUB81(qVar5,3);
          local_518.d.size._4_1_ = SUB81(qVar5,4);
          local_518.d.size._5_1_ = SUB81(qVar5,5);
          local_518.d.size._6_1_ = SUB81(qVar5,6);
          local_518.d.size._7_1_ = SUB81(qVar5,7);
          message.staticBuf[0] = (undefined1)local_518.d.size;
          message.staticBuf[1] = local_518.d.size._1_1_;
          message.staticBuf[2] = local_518.d.size._2_1_;
          message.staticBuf[3] = local_518.d.size._3_1_;
          message.staticBuf[4] = local_518.d.size._4_1_;
          message.staticBuf[5] = local_518.d.size._5_1_;
          message.staticBuf[6] = local_518.d.size._6_1_;
          message.staticBuf[7] = local_518.d.size._7_1_;
          local_518.d.size = qVar6;
          message.staticBuf._8_8_ = &local_4d8;
          QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                    ((QString *)&local_4f8,(QStringBuilder<QString,_const_QString_&> *)&message);
          pcVar19 = pcStack_4b0;
          pQVar4 = local_4b8;
          pQVar9 = local_4f8.b;
          qVar5 = local_4f8.a.m_size;
          local_4f8.a.m_size = (qsizetype)local_4b8;
          local_4b8 = (QArrayData *)qVar5;
          pcStack_4b0 = local_4f8.a.m_data;
          local_4f8.a.m_data = pcVar19;
          local_4f8.b = local_4a8;
          local_4a8 = pQVar9;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
          if (message._0_8_ != 0) {
            LOCK();
            *(int *)message._0_8_ = *(int *)message._0_8_ + -1;
            UNLOCK();
            if (*(int *)message._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)message._0_8_,2,0x10);
            }
          }
          if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            iVar11 = ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            ;
            UNLOCK();
            pQVar4 = &(local_518.d.d)->super_QArrayData;
joined_r0x00126f75:
            if (iVar11 == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
        }
        memset(&message,0xaa,0x210);
        message._size = 0x200;
        message.buf = message.staticBuf;
        message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
        QString::toLocal8Bit_helper((QChar *)&local_4f8,(longlong)pcStack_490);
        pcVar19 = local_4f8.a.m_data;
        if (local_4f8.a.m_data == (char *)0x0) {
          pcVar19 = (char *)&QByteArray::_empty;
        }
        QString::toLocal8Bit_helper((QChar *)&local_518,(longlong)pcVar14);
        pcVar21 = local_518.d.ptr;
        if (local_518.d.ptr == (char16_t *)0x0) {
          pcVar21 = (char16_t *)&QByteArray::_empty;
        }
        QString::toLocal8Bit_helper((QChar *)&local_538,(longlong)pcStack_4b0);
        pcVar17 = local_538.d.ptr;
        if (local_538.d.ptr == (char16_t *)0x0) {
          pcVar17 = (char16_t *)&QByteArray::_empty;
        }
        QString::toLocal8Bit_helper((QChar *)&local_550,(longlong)pcVar14);
        QString::toLocal8Bit_helper((QChar *)&local_568,(longlong)pcStack_4b0);
        if (local_548 == (undefined8 *)0x0) {
          local_548 = &QByteArray::_empty;
        }
        if (local_560 == (undefined8 *)0x0) {
          local_560 = &QByteArray::_empty;
        }
        QTest::qt_asprintf(&message,
                           "%stype: %s\n%smessage: %s\n%swanted: %s\n%sfound: %s\n%sexpected: %s\n%sactual: %s\n"
                           ,pcVar15,local_588,pcVar15,pcVar19,pcVar15,pcVar21,pcVar15,pcVar17,
                           pcVar15,local_548,pcVar15,local_560);
        if (local_568 != (QArrayData *)0x0) {
          LOCK();
          (local_568->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_568->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_568->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_568,1,0x10);
          }
        }
        if (local_550 != (QArrayData *)0x0) {
          LOCK();
          (local_550->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_550->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_550->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_550,1,0x10);
          }
        }
        if (&(local_538.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_538.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_538.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QArrayData *)local_4f8.a.m_size != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_4f8.a.m_size)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_4f8.a.m_size)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_4f8.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_4f8.a.m_size,1,0x10);
          }
        }
        outputBuffer(this,&message);
        if (message.buf != message.staticBuf) {
          free(message.buf);
        }
        if (&(local_4d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_4d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_4d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_4b8 != (QArrayData *)0x0) {
          LOCK();
          (local_4b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_4b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_4b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_4b8,2,0x10);
          }
        }
        if (local_590 != (QArrayData *)0x0) {
          LOCK();
          (local_590->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_590->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_590->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_590,2,0x10);
          }
        }
        if (local_498 != (QArrayData *)0x0) {
          LOCK();
          (local_498->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_498->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_498->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_498,2,0x10);
          }
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&match);
      if (local_478 != (QArrayData *)0x0) {
        LOCK();
        (local_478->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_478->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_478->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_478,2,0x10);
        }
      }
    }
    if (file != (char *)0x0) {
      memset(&message,0xaa,0x210);
      message._size = 0x200;
      message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
      message.buf = message.staticBuf;
      pcVar14 = QTestResult::currentTestObjectName();
      pcVar19 = QTestResult::currentTestFunction();
      QTest::qt_asprintf(&message,"%sat: %s::%s() (%s:%d)\n%sfile: %s\n%sline: %d\n",pcVar15,pcVar14
                         ,pcVar19,file,CONCAT44(in_register_00000084,line),pcVar15,file,pcVar15,
                         CONCAT44(in_register_00000084,line));
      outputBuffer(this,&message);
      if (message.buf != message.staticBuf) {
        free(message.buf);
      }
    }
  }
  if ((type != XFail) && (type != BlacklistedXFail)) {
    endYamlish(this);
  }
LAB_0012733b:
  if (directive.buf != directive.staticBuf) {
    free(directive.buf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTapTestLogger::addIncident(IncidentTypes type, const char *description,
                                 const char *file, int line)
{
    const bool isExpectedFail = type == XFail || type == BlacklistedXFail;
    const bool ok = (m_firstExpectedFail.isEmpty()
                     && (type == Pass || type == BlacklistedPass || type == Skip
                         || type == XPass || type == BlacklistedXPass));

    const char *const incident = [type](const char *priorXFail) {
        switch (type) {
        // We treat expected or blacklisted failures/passes as TODO-failures/passes,
        // which should be treated as soft issues by consumers. Not all do though :/
        case BlacklistedPass:
            if (priorXFail[0] != '\0')
                return priorXFail;
            Q_FALLTHROUGH();
        case XFail: case BlacklistedXFail:
        case XPass: case BlacklistedXPass:
        case BlacklistedFail:
            return "TODO";
        case Skip:
            return "SKIP";
        case Pass:
            if (priorXFail[0] != '\0')
                return priorXFail;
            Q_FALLTHROUGH();
        case Fail:
            break;
        }
        return static_cast<const char *>(nullptr);
    }(m_firstExpectedFail.constData());

    QTestCharBuffer directive;
    if (incident) {
        QTest::qt_asprintf(&directive, "%s%s%s%s",
                           isExpectedFail ? "" : " # ", incident,
                           description && description[0] ? " " : "", description);
    }

    if (!isExpectedFail) {
        m_gatherMessages = false;
        outputTestLine(ok, QTestLog::totalCount(), directive);
    } else if (m_gatherMessages && m_firstExpectedFail.isEmpty()) {
        QTestPrivate::appendCharBuffer(&m_firstExpectedFail, directive);
    }
    flushComments();

    if (!ok || !m_messages.isEmpty()) {
        // All failures need a diagnostics section to not confuse consumers.
        // We also need a diagnostics section when we have messages to report.
        if (isExpectedFail) {
            QTestCharBuffer message;
            if (m_gatherMessages) {
                QTest::qt_asprintf(&message, YAML_INDENT YAML_INDENT "- severity: xfail\n"
                                   YAML_INDENT YAML_INDENT YAML_INDENT "message:%s\n",
                                   directive.constData() + 4);
            } else {
                QTest::qt_asprintf(&message, YAML_INDENT "# xfail:%s\n", directive.constData() + 4);
            }
            outputBuffer(message);
        } else {
            beginYamlish();
        }

        if (!isExpectedFail || m_gatherMessages) {
            const char *indent = isExpectedFail ? YAML_INDENT YAML_INDENT YAML_INDENT : YAML_INDENT;
            if (!ok) {
#if QT_CONFIG(regularexpression)
                enum class OperationType {
                    Unknown,
                    Compare,    /* Plain old QCOMPARE */
                    Verify,     /* QVERIFY */
                    CompareOp,  /* QCOMPARE_OP */
                };

                // This is fragile, but unfortunately testlib doesn't plumb
                // the expected and actual values to the loggers (yet).
                static const QRegularExpression verifyRegex(
                            u"^'(?<actualexpression>.*)' returned "
                            "(?<actual>\\w+)\\. \\((?<message>.*)\\)$"_s);

                static const QRegularExpression compareRegex(
                            u"^(?<message>.*)\n"
                            "\\s*Actual\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n"
                            "\\s*Expected\\s+\\((?<expectedexpresssion>.*)\\)\\s*: "
                            "(?<expected>.*)$"_s);

                static const QRegularExpression compareOpRegex(
                            u"^(?<message>.*)\n"
                            "\\s*Computed\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n"
                            "\\s*Baseline\\s+\\((?<expectedexpresssion>.*)\\)\\s*: "
                            "(?<expected>.*)$"_s);

                const QString descriptionString = QString::fromUtf8(description);
                QRegularExpressionMatch match = verifyRegex.match(descriptionString);

                OperationType opType = OperationType::Unknown;
                if (match.hasMatch())
                    opType = OperationType::Verify;

                if (opType == OperationType::Unknown) {
                    match = compareRegex.match(descriptionString);
                    if (match.hasMatch())
                        opType = OperationType::Compare;
                }

                if (opType == OperationType::Unknown) {
                    match = compareOpRegex.match(descriptionString);
                    if (match.hasMatch())
                        opType = OperationType::CompareOp;
                }

                if (opType != OperationType::Unknown) {
                    QString message = match.captured(u"message");
                    QLatin1StringView comparisonType;
                    QString expected;
                    QString actual;
                    const auto parenthesize = [&match](QLatin1StringView key) -> QString {
                        return " ("_L1 % match.captured(key) % u')';
                    };
                    const QString actualExpression = parenthesize("actualexpression"_L1);

                    if (opType == OperationType::Verify) {
                        comparisonType = "QVERIFY"_L1;
                        actual = match.captured(u"actual").toLower() % actualExpression;
                        expected = (actual.startsWith("true "_L1) ? "false"_L1 : "true"_L1)
                                % actualExpression;
                        if (message.isEmpty())
                            message = u"Verification failed"_s;
                    } else if (opType == OperationType::Compare) {
                        comparisonType = "QCOMPARE"_L1;
                        expected = match.captured(u"expected")
                            % parenthesize("expectedexpresssion"_L1);
                        actual = match.captured(u"actual") % actualExpression;
                    } else {
                        struct ComparisonInfo {
                            const char *comparisonType;
                            const char *comparisonStringOp;
                        };
                        // get a proper comparison type based on the error message
                        const auto info = [](const QString &err) -> ComparisonInfo {
                            if (err.contains("different"_L1))
                                return { "QCOMPARE_NE", "!= " };
                            else if (err.contains("less than or equal to"_L1))
                                return { "QCOMPARE_LE", "<= " };
                            else if (err.contains("greater than or equal to"_L1))
                                return { "QCOMPARE_GE", ">= " };
                            else if (err.contains("less than"_L1))
                                return { "QCOMPARE_LT", "< " };
                            else if (err.contains("greater than"_L1))
                                return { "QCOMPARE_GT", "> " };
                            else if (err.contains("to be equal to"_L1))
                                return { "QCOMPARE_EQ", "== " };
                            else
                                return { "Unknown", "" };
                        }(message);
                        comparisonType = QLatin1StringView(info.comparisonType);
                        expected = QLatin1StringView(info.comparisonStringOp)
                                    % match.captured(u"expected")
                                    % parenthesize("expectedexpresssion"_L1);
                        actual = match.captured(u"actual") % actualExpression;
                    }

                    QTestCharBuffer diagnosticsYamlish;
                    QTest::qt_asprintf(&diagnosticsYamlish,
                                       "%stype: %s\n"
                                       "%smessage: %s\n"
                                       // Some consumers understand 'wanted/found', others need
                                       // 'expected/actual', so be compatible with both.
                                       "%swanted: %s\n"
                                       "%sfound: %s\n"
                                       "%sexpected: %s\n"
                                       "%sactual: %s\n",
                                       indent, comparisonType.latin1(),
                                       indent, qPrintable(message),
                                       indent, qPrintable(expected), indent, qPrintable(actual),
                                       indent, qPrintable(expected), indent, qPrintable(actual)
                    );

                    outputBuffer(diagnosticsYamlish);
                } else
#endif
                if (description && !incident) {
                    QTestCharBuffer unparsableDescription;
                    QTest::qt_asprintf(&unparsableDescription, YAML_INDENT "# %s\n", description);
                    outputBuffer(unparsableDescription);
                }
            }

            if (file) {
                QTestCharBuffer location;
                QTest::qt_asprintf(&location,
                                   // The generic 'at' key is understood by most consumers.
                                   "%sat: %s::%s() (%s:%d)\n"

                                   // The file and line keys are for consumers that are able
                                   // to read more granular location info.
                                   "%sfile: %s\n"
                                   "%sline: %d\n",

                                   indent, QTestResult::currentTestObjectName(),
                                   QTestResult::currentTestFunction(),
                                   file, line, indent, file, indent, line
                    );
                outputBuffer(location);
            }
        }

        if (!isExpectedFail)
            endYamlish();
    }
}